

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

GeneratorVirtualScriptFunction * __thiscall
Js::JavascriptLibrary::CreateGeneratorVirtualScriptFunction
          (JavascriptLibrary *this,FunctionProxy *proxy)

{
  Type TVar1;
  ScriptFunctionType *deferredPrototypeType;
  Recycler *pRVar2;
  FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_> *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  deferredPrototypeType = FunctionProxy::EnsureDeferredPrototypeType(proxy);
  TVar1 = ((proxy->functionInfo).ptr)->attributes;
  pRVar2 = this->recycler;
  if ((TVar1 >> 0x17 & 1) == 0) {
    if ((TVar1 >> 0x19 & 1) == 0) {
      local_50 = (undefined1  [8])&GeneratorVirtualScriptFunction::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_74a5554;
      data.filename._0_4_ = 0x192d;
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_50);
      this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>
                 *)new<(Memory::ObjectInfoBits)1>
                             (0x50,pRVar2,
                              (InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27);
      GeneratorVirtualScriptFunction::GeneratorVirtualScriptFunction
                ((GeneratorVirtualScriptFunction *)this_00,proxy,deferredPrototypeType);
    }
    else {
      local_50 = (undefined1  [8])&FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::typeinfo
      ;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_74a5554;
      data.filename._0_4_ = 0x1929;
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_50);
      this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>
                 *)new<(Memory::ObjectInfoBits)1>
                             (0x58,pRVar2,
                              (InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27);
      FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::FunctionWithHomeObj
                ((FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction> *)this_00,proxy,
                 deferredPrototypeType);
    }
  }
  else if ((TVar1 >> 0x19 & 1) == 0) {
    local_50 = (undefined1  [8])
               &FunctionWithComputedName<Js::GeneratorVirtualScriptFunction>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x192b;
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_50);
    this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>
               *)new<(Memory::ObjectInfoBits)1>
                           (0x58,pRVar2,
                            (InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27);
    FunctionWithComputedName<Js::GeneratorVirtualScriptFunction>::FunctionWithComputedName
              ((FunctionWithComputedName<Js::GeneratorVirtualScriptFunction> *)this_00,proxy,
               deferredPrototypeType);
  }
  else {
    local_50 = (undefined1  [8])
               &FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x1925;
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_50);
    this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>
               *)new<(Memory::ObjectInfoBits)1>
                           (0x60,pRVar2,
                            (InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27);
    FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>::
    FunctionWithComputedName(this_00,proxy,deferredPrototypeType);
  }
  return (GeneratorVirtualScriptFunction *)this_00;
}

Assistant:

GeneratorVirtualScriptFunction* JavascriptLibrary::CreateGeneratorVirtualScriptFunction(FunctionProxy * proxy)
    {
        ScriptFunctionType* deferredPrototypeType = proxy->EnsureDeferredPrototypeType();
        FunctionInfo* functionInfo = proxy->GetFunctionInfo();
        if (functionInfo->HasComputedName() || functionInfo->HasHomeObj())
        {
            if (functionInfo->HasComputedName() && functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithComputedName<FunctionWithHomeObj<GeneratorVirtualScriptFunction>>, proxy, deferredPrototypeType);
            }
            else if (functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithHomeObj<GeneratorVirtualScriptFunction>, proxy, deferredPrototypeType);
            }
            return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, GeneratorVirtualScriptFunctionWithComputedName, proxy, deferredPrototypeType);
        }
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, GeneratorVirtualScriptFunction, proxy, deferredPrototypeType);
    }